

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::json_abi_v3_11_3::detail::
binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
::get_number<unsigned_char,false>
          (binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
           *this,input_format_t format,uchar *result)

{
  bool bVar1;
  reference pvVar2;
  pointer pvVar3;
  value_type_conflict4 *in_RDX;
  int in_ESI;
  long in_RDI;
  size_t i;
  array<unsigned_char,_1UL> vec;
  char *in_stack_000000d8;
  input_format_t in_stack_000000e4;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_000000e8;
  size_type in_stack_ffffffffffffffb8;
  undefined6 in_stack_ffffffffffffffc0;
  value_type_conflict4 in_stack_ffffffffffffffc6;
  value_type_conflict4 in_stack_ffffffffffffffc7;
  undefined1 local_21;
  value_type_conflict4 *local_20;
  int local_14;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  memset(&local_21,0,1);
  bVar1 = false;
  while( true ) {
    if (bVar1) {
      pvVar3 = std::array<unsigned_char,_1UL>::data((array<unsigned_char,_1UL> *)0x2776bb);
      *local_20 = *pvVar3;
      return true;
    }
    binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
    ::get((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
           *)CONCAT17(in_stack_ffffffffffffffc7,
                      CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)));
    bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
            ::unexpect_eof(in_stack_000000e8,in_stack_000000e4,in_stack_000000d8);
    if (((bVar1 ^ 0xffU) & 1) != 0) break;
    if ((bool)(*(byte *)(in_RDI + 0x20) & 1) == (local_14 == 5)) {
      in_stack_ffffffffffffffc6 = (value_type_conflict4)*(undefined4 *)(in_RDI + 0x10);
      pvVar2 = std::array<unsigned_char,_1UL>::operator[]
                         ((array<unsigned_char,_1UL> *)
                          CONCAT17(in_stack_ffffffffffffffc7,
                                   CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)),
                          in_stack_ffffffffffffffb8);
      *pvVar2 = in_stack_ffffffffffffffc6;
    }
    else {
      in_stack_ffffffffffffffc7 = (value_type_conflict4)*(undefined4 *)(in_RDI + 0x10);
      pvVar2 = std::array<unsigned_char,_1UL>::operator[]
                         ((array<unsigned_char,_1UL> *)
                          CONCAT17(in_stack_ffffffffffffffc7,
                                   CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)),
                          in_stack_ffffffffffffffb8);
      *pvVar2 = in_stack_ffffffffffffffc7;
    }
    bVar1 = true;
  }
  return false;
}

Assistant:

bool get_number(const input_format_t format, NumberType& result)
    {
        // step 1: read input into array with system's byte order
        std::array<std::uint8_t, sizeof(NumberType)> vec{};
        for (std::size_t i = 0; i < sizeof(NumberType); ++i)
        {
            get();
            if (JSON_HEDLEY_UNLIKELY(!unexpect_eof(format, "number")))
            {
                return false;
            }

            // reverse byte order prior to conversion if necessary
            if (is_little_endian != (InputIsLittleEndian || format == input_format_t::bjdata))
            {
                vec[sizeof(NumberType) - i - 1] = static_cast<std::uint8_t>(current);
            }
            else
            {
                vec[i] = static_cast<std::uint8_t>(current); // LCOV_EXCL_LINE
            }
        }

        // step 2: convert array into number of type T and return
        std::memcpy(&result, vec.data(), sizeof(NumberType));
        return true;
    }